

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

QList<QRect> * QMdi::MinOverlapPlacer::findMaxOverlappers(QRect *domain,QList<QRect> *source)

{
  bool bVar1;
  int iVar2;
  const_iterator o;
  QList<QRect> *in_RDX;
  QList<QRect> *in_RDI;
  long in_FS_OFFSET;
  int overlap;
  QRect *srcRect;
  QList<QRect> *__range1;
  int maxOverlap;
  QList<QRect> *result;
  QRect intersection;
  const_iterator __end1;
  const_iterator __begin1;
  QRect *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  QList<QRect> *in_stack_ffffffffffffffa8;
  int local_50;
  qsizetype in_stack_ffffffffffffffe8;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QRect>::QList((QList<QRect> *)0x60d5a2);
  QList<QRect>::size(in_RDX);
  QList<QRect>::reserve(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffe8);
  local_50 = -1;
  local_10.i = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QRect>::begin((QList<QRect> *)
                                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  o = QList<QRect>::end((QList<QRect> *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  while (bVar1 = QList<QRect>::const_iterator::operator!=(&local_10,o), bVar1) {
    QList<QRect>::const_iterator::operator*(&local_10);
    QRect::intersected((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff84 = QRect::width(in_stack_ffffffffffffff78);
    iVar2 = QRect::height(in_stack_ffffffffffffff78);
    iVar2 = in_stack_ffffffffffffff84 * iVar2;
    if ((local_50 <= iVar2) || (local_50 == -1)) {
      if (local_50 < iVar2) {
        QList<QRect>::clear((QList<QRect> *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        local_50 = iVar2;
      }
      QList<QRect>::operator<<
                ((QList<QRect> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
    }
    QList<QRect>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<QRect> MinOverlapPlacer::findMaxOverlappers(const QRect &domain, const QList<QRect> &source)
{
    QList<QRect> result;
    result.reserve(source.size());

    int maxOverlap = -1;
    for (const QRect &srcRect : source) {
        QRect intersection = domain.intersected(srcRect);
        const int overlap = intersection.width() * intersection.height();
        if (overlap >= maxOverlap || maxOverlap == -1) {
            if (overlap > maxOverlap) {
                maxOverlap = overlap;
                result.clear();
            }
            result << srcRect;
        }
    }

    return result;
}